

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,should_visit_unknown_tags_in_non_strict_mode::VisitRules>
::
callVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>
          (MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,should_visit_unknown_tags_in_non_strict_mode::VisitRules>
           *this,MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                 *header,
          MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
          *message)

{
  Visitor *this_00;
  MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  local_438;
  MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  local_1a0;
  
  this_00 = *(Visitor **)(this + 8);
  MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  ::MessageBase(&local_438,header);
  MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  ::MessageBase(&local_1a0,message);
  should_visit_unknown_tags_in_non_strict_mode::Visitor::operator()
            (this_00,(VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      *)&local_438,
             (VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
              *)&local_1a0);
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
  ::~SmallVectorImpl(&local_1a0.unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
                    );
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
  ::~SmallVectorImpl(&local_438.unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
                    );
  return;
}

Assistant:

void callVisitor(const Header& header, const Message& message, std::true_type /* is_void */)
            {
                visitor(header, message);
            }